

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayCardsAction.cpp
# Opt level: O0

void __thiscall PlayCardsAction::inversePlayBy(PlayCardsAction *this,Player *p)

{
  undefined8 uVar1;
  string local_68;
  CardGroup local_38;
  Player *local_18;
  Player *p_local;
  PlayCardsAction *this_local;
  
  local_18 = p;
  p_local = (Player *)this;
  CardGroup::CardGroup(&local_38,&this->cards);
  Player::addCards(p,&local_38);
  CardGroup::~CardGroup(&local_38);
  Player::getName_abi_cxx11_(&local_68,local_18);
  uVar1 = std::__cxx11::string::c_str();
  printf("PlayCardsAction: %s withdraw ",uVar1);
  std::__cxx11::string::~string((string *)&local_68);
  CardGroup::print(&this->cards);
  puts("");
  return;
}

Assistant:

void PlayCardsAction::inversePlayBy(Player* p) const {
        p->addCards(this->cards);
        printf("PlayCardsAction: %s withdraw ", p->getName().c_str());
        this->cards.print();
        puts("");
}